

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O0

void __thiscall
alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::Iterator::
initialize(Iterator *this)

{
  long *in_RDI;
  int bit_pos;
  int in_stack_ffffffffffffffe4;
  Iterator *in_stack_ffffffffffffffe8;
  
  if (*in_RDI != 0) {
    if ((int)in_RDI[1] < 0) {
      __assert_fail("cur_idx_ >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/core/alex.h"
                    ,0xa0b,
                    "void alex::Alex<int, int, alex::AlexCompare, std::allocator<std::pair<int, int>>, false>::Iterator::initialize() [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = false]"
                   );
    }
    if (*(int *)(*in_RDI + 0x58) <= (int)in_RDI[1]) {
      *in_RDI = *(long *)(*in_RDI + 0x38);
      *(undefined4 *)(in_RDI + 1) = 0;
      if (*in_RDI == 0) {
        return;
      }
    }
    *(int *)((long)in_RDI + 0xc) = (int)in_RDI[1] >> 6;
    in_RDI[2] = *(long *)(*(long *)(*in_RDI + 0x60) + (long)*(int *)((long)in_RDI + 0xc) * 8);
    in_RDI[2] = ((1L << ((byte)(int)in_RDI[1] & 0x3f)) - 1U ^ 0xffffffffffffffff) & in_RDI[2];
    operator++(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4);
  }
  return;
}

Assistant:

void initialize() {
      if (!cur_leaf_) return;
      assert(cur_idx_ >= 0);
      if (cur_idx_ >= cur_leaf_->data_capacity_) {
        cur_leaf_ = cur_leaf_->next_leaf_;
        cur_idx_ = 0;
        if (!cur_leaf_) return;
      }

      cur_bitmap_idx_ = cur_idx_ >> 6;
      cur_bitmap_data_ = cur_leaf_->bitmap_[cur_bitmap_idx_];

      // Zero out extra bits
      int bit_pos = cur_idx_ - (cur_bitmap_idx_ << 6);
      cur_bitmap_data_ &= ~((1ULL << bit_pos) - 1);

      (*this)++;
    }